

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

bool baryonyx::itm::
     is_valid_constraint<baryonyx::itm::solver_inequalities_01coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,true>,baryonyx::bit_array>
               (solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>
                *slv,int k,bit_array *x)

{
  unsigned_long *puVar1;
  bound_factor *pbVar2;
  byte bVar3;
  ulong uVar4;
  undefined8 uVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  long in_R8;
  undefined1 auVar9 [16];
  undefined1 auVar11 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  int iVar18;
  undefined1 auVar19 [64];
  undefined1 local_30 [16];
  undefined1 auVar10 [32];
  undefined1 auVar12 [32];
  
  sparse_matrix<int>::row((sparse_matrix<int> *)local_30,(int)slv + 0x10);
  if (local_30._8_8_ == local_30._0_8_) {
    iVar18 = 0;
  }
  else {
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxbd_avx2(ZEXT816(0x3830282018100800));
    auVar12._8_4_ = 0xffffffc0;
    auVar12._0_8_ = 0xffffffc0ffffffc0;
    auVar12._12_4_ = 0xffffffc0;
    auVar12._16_4_ = 0xffffffc0;
    auVar12._20_4_ = 0xffffffc0;
    auVar12._24_4_ = 0xffffffc0;
    auVar12._28_4_ = 0xffffffc0;
    auVar14 = vpbroadcastq_avx512f(ZEXT816(1));
    lVar7 = local_30._0_8_ - local_30._8_8_;
    puVar1 = (x->super_bit_array_impl).m_data._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    uVar8 = 0;
    auVar15 = vpbroadcastq_avx512f();
    auVar16 = vpsrlq_avx512f(auVar15,3);
    auVar15 = ZEXT1664((undefined1  [16])0x0);
    do {
      auVar19 = auVar15;
      auVar15 = vpbroadcastq_avx512f();
      uVar8 = uVar8 + 8;
      auVar15 = vporq_avx512f(auVar15,auVar13);
      uVar4 = vpcmpuq_avx512f(auVar15,auVar16,2);
      auVar10 = vpgatherdd_avx512vl(*(undefined4 *)(local_30._8_8_ + (long)puVar1 + 4));
      bVar3 = (byte)uVar4;
      auVar11._4_4_ = (uint)((byte)(uVar4 >> 1) & 1) * auVar10._4_4_;
      auVar11._0_4_ = (uint)(bVar3 & 1) * auVar10._0_4_;
      auVar11._8_4_ = (uint)((byte)(uVar4 >> 2) & 1) * auVar10._8_4_;
      auVar11._12_4_ = (uint)((byte)(uVar4 >> 3) & 1) * auVar10._12_4_;
      auVar11._16_4_ = (uint)((byte)(uVar4 >> 4) & 1) * auVar10._16_4_;
      auVar11._20_4_ = (uint)((byte)(uVar4 >> 5) & 1) * auVar10._20_4_;
      auVar11._24_4_ = (uint)((byte)(uVar4 >> 6) & 1) * auVar10._24_4_;
      auVar11._28_4_ = (uint)(byte)(uVar4 >> 7) * auVar10._28_4_;
      local_30._8_8_ = local_30._8_8_ + 0x40;
      auVar10 = vpsrad_avx2(auVar11,0x1f);
      auVar10 = vpsrld_avx2(auVar10,0x1a);
      auVar10 = vpaddd_avx2(auVar11,auVar10);
      vpsrad_avx2(auVar10,6);
      auVar10 = vpand_avx2(auVar10,auVar12);
      auVar10 = vpsubd_avx2(auVar11,auVar10);
      auVar15 = vpgatherdq_avx512f((int)puVar1[in_R8]);
      auVar17._8_8_ = (ulong)((byte)(uVar4 >> 1) & 1) * auVar15._8_8_;
      auVar17._0_8_ = (ulong)(bVar3 & 1) * auVar15._0_8_;
      auVar17._16_8_ = (ulong)((byte)(uVar4 >> 2) & 1) * auVar15._16_8_;
      auVar17._24_8_ = (ulong)((byte)(uVar4 >> 3) & 1) * auVar15._24_8_;
      auVar17._32_8_ = (ulong)((byte)(uVar4 >> 4) & 1) * auVar15._32_8_;
      auVar17._40_8_ = (ulong)((byte)(uVar4 >> 5) & 1) * auVar15._40_8_;
      auVar17._48_8_ = (ulong)((byte)(uVar4 >> 6) & 1) * auVar15._48_8_;
      auVar17._56_8_ = (uVar4 >> 7) * auVar15._56_8_;
      auVar15 = vpmovzxdq_avx512f(auVar10);
      auVar15 = vpsrlvq_avx512f(auVar17,auVar15);
      uVar5 = vptestmq_avx512f(auVar15,auVar14);
      auVar10 = vpmovm2d_avx512vl(uVar5);
      auVar10 = vpsubd_avx2(auVar19._0_32_,auVar10);
      auVar15 = ZEXT3264(auVar10);
    } while (((lVar7 - 8U >> 3) + 8 & 0xfffffffffffffff8) != uVar8);
    auVar12 = vmovdqa32_avx512vl(auVar10);
    auVar9._0_4_ = (uint)(bVar3 & 1) * auVar12._0_4_ | (uint)!(bool)(bVar3 & 1) * auVar19._0_4_;
    bVar6 = (bool)((byte)(uVar4 >> 1) & 1);
    auVar9._4_4_ = (uint)bVar6 * auVar12._4_4_ | (uint)!bVar6 * auVar19._4_4_;
    bVar6 = (bool)((byte)(uVar4 >> 2) & 1);
    auVar9._8_4_ = (uint)bVar6 * auVar12._8_4_ | (uint)!bVar6 * auVar19._8_4_;
    bVar6 = (bool)((byte)(uVar4 >> 3) & 1);
    auVar9._12_4_ = (uint)bVar6 * auVar12._12_4_ | (uint)!bVar6 * auVar19._12_4_;
    bVar6 = (bool)((byte)(uVar4 >> 4) & 1);
    auVar10._16_4_ = (uint)bVar6 * auVar12._16_4_ | (uint)!bVar6 * auVar19._16_4_;
    auVar10._0_16_ = auVar9;
    bVar6 = (bool)((byte)(uVar4 >> 5) & 1);
    auVar10._20_4_ = (uint)bVar6 * auVar12._20_4_ | (uint)!bVar6 * auVar19._20_4_;
    bVar6 = (bool)((byte)(uVar4 >> 6) & 1);
    auVar10._24_4_ = (uint)bVar6 * auVar12._24_4_ | (uint)!bVar6 * auVar19._24_4_;
    bVar6 = SUB81(uVar4 >> 7,0);
    auVar10._28_4_ = (uint)bVar6 * auVar12._28_4_ | (uint)!bVar6 * auVar19._28_4_;
    auVar9 = vphaddd_avx(auVar10._16_16_,auVar9);
    auVar9 = vphaddd_avx(auVar9,auVar9);
    auVar9 = vphaddd_avx(auVar9,auVar9);
    iVar18 = auVar9._0_4_;
  }
  pbVar2 = (slv->b)._M_t.
           super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor[]>_>
           .
           super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_true>::bound_factor_*,_false>
           ._M_head_impl;
  if (iVar18 < pbVar2[k].min) {
    bVar6 = false;
  }
  else {
    bVar6 = iVar18 <= pbVar2[k].max;
  }
  return bVar6;
}

Assistant:

bool
is_valid_constraint(const Solver& slv, int k, const Xtype& x)
{
    typename sparse_matrix<int>::const_row_iterator it, et;

    std::tie(it, et) = slv.ap.row(k);
    int v = 0;

    for (; it != et; ++it)
        v += slv.factor(it->value) * x[it->column];

    return slv.bound_min(k) <= v && v <= slv.bound_max(k);
}